

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this,
          initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> cont)

{
  const_iterator pMVar1;
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_RDI;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *x;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *__range2;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff88;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff90;
  const_iterator local_28;
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_10;
  
  std::initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::size
            (&local_10);
  Stack((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
        in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
  local_28 = std::initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
             ::begin(&local_10);
  pMVar1 = std::initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
           end(in_RDI);
  for (; local_28 != pMVar1; local_28 = local_28 + 1) {
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    push((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
         in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x379114);
  }
  return;
}

Assistant:

Stack(std::initializer_list<C> cont)
   : Stack(cont.size())
  {
    for (auto const& x : cont) {
      push(x);
    }
  }